

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O2

void ihevc_itrans_8x8(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                     WORD32 i4_shift,WORD32 zero_cols)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  WORD32 o [4];
  int local_a8 [6];
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  WORD32 e [4];
  int local_48 [6];
  
  bVar5 = (byte)i4_shift;
  iVar11 = 1 << (bVar5 - 1 & 0x1f);
  lVar8 = (long)src_strd;
  local_68 = (long)(src_strd * 3);
  local_70 = (long)(src_strd * 5);
  local_78 = (long)(src_strd * 7);
  local_80 = (long)(src_strd * 2);
  local_88 = (long)(src_strd * 6);
  e[0] = (int)lVar8;
  e[1] = (int)((ulong)lVar8 >> 0x20);
  local_90 = (long)(src_strd * 4);
  lVar10 = (long)dst_strd * 2;
  e._8_8_ = lVar10;
  for (iVar7 = 0; iVar7 != 8; iVar7 = iVar7 + 1) {
    if ((zero_cols & 1U) == 0) {
      sVar1 = pi2_src[lVar8];
      sVar2 = pi2_src[src_strd * 3];
      sVar3 = pi2_src[src_strd * 5];
      sVar4 = pi2_src[src_strd * 7];
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        local_48[lVar10] =
             (int)g_ai2_ihevc_trans_8[7][lVar10] * (int)sVar4 +
             (int)g_ai2_ihevc_trans_8[5][lVar10] * (int)sVar3 +
             (int)g_ai2_ihevc_trans_8[3][lVar10] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_8[1][lVar10] * (int)sVar1;
      }
      iVar12 = pi2_src[src_strd * 6] * 0x24 + pi2_src[src_strd * 2] * 0x53;
      iVar6 = pi2_src[src_strd * 6] * -0x53 + pi2_src[src_strd * 2] * 0x24;
      iVar15 = pi2_src[src_strd * 4] * 0x40 + *pi2_src * 0x40;
      iVar9 = pi2_src[src_strd * 4] * -0x40 + *pi2_src * 0x40;
      local_a8[0] = iVar15 + iVar12;
      local_a8[3] = iVar15 - iVar12;
      local_a8[1] = iVar9 + iVar6;
      local_a8[2] = iVar9 - iVar6;
      lVar13 = 0xc;
      for (lVar14 = 0; lVar10 = e._8_8_, lVar14 != 8; lVar14 = lVar14 + 2) {
        iVar6 = *(int *)((long)local_a8 + lVar14 * 2) + iVar11 +
                *(int *)((long)local_48 + lVar14 * 2) >> (bVar5 & 0x1f);
        if (iVar6 < -0x7fff) {
          iVar6 = -0x8000;
        }
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        *(short *)((long)pi2_dst + lVar14) = (short)iVar6;
        iVar6 = (*(int *)((long)local_a8 + lVar13) + iVar11) - *(int *)((long)local_48 + lVar13) >>
                (bVar5 & 0x1f);
        if (iVar6 < -0x7fff) {
          iVar6 = -0x8000;
        }
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        *(short *)((long)pi2_dst + lVar14 + 8) = (short)iVar6;
        lVar13 = lVar13 + -4;
      }
    }
    else {
      pi2_dst[0] = 0;
      pi2_dst[1] = 0;
      pi2_dst[2] = 0;
      pi2_dst[3] = 0;
      pi2_dst[4] = 0;
      pi2_dst[5] = 0;
      pi2_dst[6] = 0;
      pi2_dst[7] = 0;
    }
    pi2_src = pi2_src + 1;
    pi2_dst = (WORD16 *)((long)pi2_dst + lVar10);
    zero_cols = zero_cols >> 1;
  }
  return;
}

Assistant:

void ihevc_itrans_8x8(WORD16 *pi2_src,
                      WORD16 *pi2_dst,
                      WORD32 src_strd,
                      WORD32 dst_strd,
                      WORD32 i4_shift,
                      WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[4], o[4];
    WORD32 ee[2], eo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_8; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_8 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 4; k++)
            {
                o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_8[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_8[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_8[7][k]
                                                * pi2_src[7 * src_strd];
            }

            eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd]
                            + g_ai2_ihevc_trans_8[6][0] * pi2_src[6 * src_strd];
            eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd]
                            + g_ai2_ihevc_trans_8[6][1] * pi2_src[6 * src_strd];
            ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_8[4][0] * pi2_src[4 * src_strd];
            ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_8[4][1] * pi2_src[4 * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            e[0] = ee[0] + eo[0];
            e[3] = ee[0] - eo[0];
            e[1] = ee[1] + eo[1];
            e[2] = ee[1] - eo[1];
            for(k = 0; k < 4; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 4] =
                                CLIP_S16(((e[3 - k] - o[3 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}